

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::GetLastWarnings_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  pointer pWVar2;
  allocator local_31;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  for (pWVar2 = (this->m_WarningList).
                super__Vector_base<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>._M_impl.
                super__Vector_impl_data._M_start;
      pWVar2 != (this->m_WarningList).
                super__Vector_base<kws::WarningStruct,_std::allocator<kws::WarningStruct>_>._M_impl.
                super__Vector_impl_data._M_finish; pWVar2 = pWVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (char *)operator_new__(10);
    snprintf(pcVar1,10,"%ld",pWVar2->number);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    operator_delete__(pcVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (char *)operator_new__(10);
    snprintf(pcVar1,10,"%ld",pWVar2->line);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    operator_delete__(pcVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetLastWarnings()
{
  std::string output = "";
  std::vector<Warning>::const_iterator it = m_WarningList.begin();
  while(it != m_WarningList.end())
    {
    output += "Warning #";
    constexpr size_t length = 10;
    char* val = new char[length];
    snprintf(val,length,"%ld",(*it).number);
    output += val;
    delete [] val;
    output += " (";
    val = new char[length];
    snprintf(val,length,"%ld",(*it).line);
    output += val;
    delete [] val;
    output += ") ";
    output += (*it).description;
    output += "\n";
    it++;
    }
  return output;
}